

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t _elemsize;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 in_EAX;
  int iVar13;
  int iVar14;
  long lVar15;
  undefined1 auVar16 [16];
  Option *opt_00;
  Mat local_88;
  Option *local_38;
  
  iVar14 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  iVar4 = this->stride_w;
  iVar5 = this->kernel_h;
  iVar6 = this->dilation_h;
  iVar7 = this->stride_h;
  iVar8 = this->output_pad_right;
  iVar9 = this->output_pad_bottom;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  auVar16._0_4_ = -(uint)(0 < this->pad_left);
  auVar16._4_4_ = -(uint)(0 < this->pad_right);
  auVar16._8_4_ = -(uint)(0 < this->pad_top);
  auVar16._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar13 = movmskps(in_EAX,auVar16);
  lVar15 = 0x10;
  if ((iVar13 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar15 = 8, &local_88 != top_blob)))) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    lVar15 = 8;
    local_88.data = top_blob->data;
    local_88.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_88.elemsize = top_blob->elemsize;
    local_88.elempack = top_blob->elempack;
    local_88.allocator = top_blob->allocator;
    uVar11 = top_blob->dims;
    uVar12 = top_blob->w;
    local_88.h = top_blob->h;
    local_88.d = top_blob->d;
    local_88.c = top_blob->c;
    local_88.cstep = top_blob->cstep;
    local_88.dims = uVar11;
    local_88.w = uVar12;
  }
  opt_00 = (Option *)0x446a21;
  local_38 = opt;
  Mat::create(&local_88,iVar8 + (iVar2 + -1) * iVar3 + (iVar14 + -1) * iVar4 + 1,
              iVar9 + 1 + (iVar5 + -1) * iVar6 + (iVar1 + -1) * iVar7,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar15));
  iVar14 = -100;
  if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
    deconvolutiondepthwise
              (bottom_blob,&local_88,&this->weight_data,&this->bias_data,this->kernel_w,
               this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
               this->group,this->activation_type,&this->activation_params,opt_00);
    cut_padding(this,&local_88,top_blob,local_38);
    if ((top_blob->data == (void *)0x0) || (iVar14 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
      iVar14 = -100;
    }
  }
  piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}